

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMRangeImpl::updateRangeForDeletedNode(DOMRangeImpl *this,DOMNode *node)

{
  int iVar1;
  DOMNode *node_1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar3;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  DOMRangeImpl *pDVar4;
  bool bVar5;
  undefined4 extraout_var_03;
  
  if ((node != (DOMNode *)0x0) && (this->fRemoveChild != node)) {
    pDVar4 = (DOMRangeImpl *)node;
    iVar1 = (*node->_vptr_DOMNode[5])();
    if ((DOMNode *)CONCAT44(extraout_var,iVar1) == this->fStartContainer) {
      XVar2 = indexOf(pDVar4,node,this->fStartContainer);
      if (XVar2 < this->fStartOffset) {
        this->fStartOffset = this->fStartOffset - 1;
      }
    }
    pDVar4 = (DOMRangeImpl *)node;
    iVar1 = (*node->_vptr_DOMNode[5])();
    if ((DOMNode *)CONCAT44(extraout_var_00,iVar1) == this->fEndContainer) {
      XVar2 = indexOf(pDVar4,node,this->fEndContainer);
      if (XVar2 < this->fEndOffset) {
        this->fEndOffset = this->fEndOffset - 1;
      }
    }
    iVar1 = (*node->_vptr_DOMNode[5])(node);
    pDVar3 = this->fStartContainer;
    if ((DOMNode *)CONCAT44(extraout_var_01,iVar1) == pDVar3) {
      iVar1 = (*node->_vptr_DOMNode[5])(node);
      if ((DOMNode *)CONCAT44(extraout_var_02,iVar1) == this->fEndContainer) {
        return;
      }
      pDVar3 = this->fStartContainer;
    }
    bVar5 = pDVar3 != (DOMNode *)0x0;
    if (pDVar3 != node && bVar5) {
      do {
        iVar1 = (*pDVar3->_vptr_DOMNode[5])(pDVar3);
        pDVar3 = (DOMNode *)CONCAT44(extraout_var_03,iVar1);
        bVar5 = pDVar3 != (DOMNode *)0x0;
        if (pDVar3 == node) break;
      } while (pDVar3 != (DOMNode *)0x0);
    }
    if (bVar5) {
      iVar1 = (*node->_vptr_DOMNode[5])(node);
      pDVar4 = this;
      setStartContainer(this,(DOMNode *)CONCAT44(extraout_var_04,iVar1));
      XVar2 = indexOf(pDVar4,node,(DOMNode *)CONCAT44(extraout_var_04,iVar1));
      this->fStartOffset = XVar2;
    }
    pDVar3 = this->fEndContainer;
    bVar5 = pDVar3 != (DOMNode *)0x0;
    if (pDVar3 != node && bVar5) {
      do {
        iVar1 = (*pDVar3->_vptr_DOMNode[5])(pDVar3);
        pDVar3 = (DOMNode *)CONCAT44(extraout_var_05,iVar1);
        bVar5 = pDVar3 != (DOMNode *)0x0;
        if (pDVar3 == node) break;
      } while (pDVar3 != (DOMNode *)0x0);
    }
    if (bVar5) {
      iVar1 = (*node->_vptr_DOMNode[5])(node);
      pDVar4 = this;
      setEndContainer(this,(DOMNode *)CONCAT44(extraout_var_06,iVar1));
      XVar2 = indexOf(pDVar4,node,(DOMNode *)CONCAT44(extraout_var_06,iVar1));
      this->fEndOffset = XVar2;
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::updateRangeForDeletedNode(DOMNode* node)
{

    if (node == 0) return;
    if (fRemoveChild == node) return;

    if (node->getParentNode() == fStartContainer) {
        XMLSize_t index = indexOf(node, fStartContainer);
        if ( fStartOffset > index) {
            fStartOffset--;
        }
    }

    if (node->getParentNode() == fEndContainer) {
        XMLSize_t index = indexOf(node, fEndContainer);
        if ( fEndOffset > index) {
            fEndOffset--;
        }
    }

    if (node->getParentNode() != fStartContainer
        ||  node->getParentNode() != fEndContainer) {
        if (isAncestorOf(node, fStartContainer)) {
            DOMNode* tpNode = node->getParentNode();
            setStartContainer( tpNode );
            fStartOffset = indexOf( node, tpNode);
        }
        if (isAncestorOf(node, fEndContainer)) {
            DOMNode* tpNode = node->getParentNode();
            setEndContainer( tpNode );
            fEndOffset = indexOf( node, tpNode);
        }
    }

}